

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txindex_tests.cpp
# Opt level: O2

void __thiscall txindex_tests::txindex_initial_sync::test_method(txindex_initial_sync *this)

{
  long lVar1;
  pointer psVar2;
  element_type *peVar3;
  readonly_property65 rVar4;
  bool bVar5;
  SignalInterrupt **ppSVar6;
  CChainParams *pCVar7;
  CKey *this_00;
  int iVar8;
  pointer psVar9;
  Txid *other;
  iterator pvVar10;
  char *pcVar11;
  iterator pvVar12;
  iterator in_R9;
  shared_ptr<const_CTransaction> *txn_1;
  shared_ptr<const_CTransaction> *txn;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  assertion_result local_3b0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  CTransactionRef tx_disk;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  long *local_210;
  undefined1 local_208 [16];
  undefined1 *local_1f8;
  CScript *local_1f0;
  undefined1 local_1c0;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_1b8;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> no_txns;
  assertion_result local_180;
  char **local_168;
  CScript coinbase_script_pub_key;
  uint256 block_hash;
  TxIndex txindex;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  interfaces::MakeChain
            ((interfaces *)&local_210,
             &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
              super_BasicTestingSetup.m_node);
  pvVar10 = (iterator)0x0;
  TxIndex::TxIndex(&txindex,(unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>)
                            &local_210,0x100000,true,false);
  if (local_210 != (long *)0x0) {
    (**(code **)(*local_210 + 8))();
  }
  local_210 = (long *)0x0;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = pvVar10;
  file.m_end = (iterator)0x14;
  file.m_begin = (iterator)&local_220;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_230,msg);
  rVar4.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)BaseIndex::Init(&txindex.super_BaseIndex);
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       rVar4.super_readonly_property<bool>.super_class_property<bool>.value;
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = (CScript *)&block_hash;
  block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_12198d2;
  block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = (long)"txindex.Init()" + 0xe;
  local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
  local_208._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
  ;
  local_238 = "";
  pvVar10 = (iterator)0x2;
  pvVar12 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)local_208,2,0,WARN,(check_type)this,(size_t)&local_240,0x14)
  ;
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  tx_disk.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  tx_disk.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  psVar2 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar9 = (this->super_TestChain100Setup).m_coinbase_txns.
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar2; psVar9 = psVar9 + 1) {
    local_268 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
    ;
    local_260 = "";
    local_278 = &boost::unit_test::basic_cstring<char_const>::null;
    local_270 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar12;
    msg_00.m_begin = pvVar10;
    file_00.m_end = (iterator)0x1b;
    file_00.m_begin = (iterator)&local_268;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_278,
               msg_00);
    bVar5 = TxIndex::FindTx(&txindex,&(((psVar9->
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->hash).m_wrapped,&block_hash,&tx_disk);
    local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)!bVar5;
    local_180.m_message.px = (element_type *)0x0;
    local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
    coinbase_script_pub_key.super_CScriptBase._union.indirect_contents.indirect =
         "!txindex.FindTx(txn->GetHash(), block_hash, tx_disk)";
    coinbase_script_pub_key.super_CScriptBase._union._8_8_ =
         (long)"!txindex.FindTx(txn->GetHash(), block_hash, tx_disk)" + 0x34;
    local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
    local_208._0_8_ = &PTR__lazy_ostream_0113a070;
    local_1f8 = boost::unit_test::lazy_ostream::inst;
    local_1f0 = &coinbase_script_pub_key;
    local_288 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
    ;
    local_280 = "";
    pvVar10 = &DAT_00000001;
    pvVar12 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_180,(lazy_ostream *)local_208,1,0,WARN,(check_type)this,(size_t)&local_288,
               0x1b);
    boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  }
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar12;
  msg_01.m_begin = pvVar10;
  file_01.m_end = (iterator)0x1f;
  file_01.m_begin = (iterator)&local_298;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2a8,
             msg_01);
  bVar5 = BaseIndex::BlockUntilSyncedToCurrentChain(&txindex.super_BaseIndex);
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  coinbase_script_pub_key.super_CScriptBase._union.indirect_contents.indirect =
       "!txindex.BlockUntilSyncedToCurrentChain()";
  coinbase_script_pub_key.super_CScriptBase._union._8_8_ =
       (long)"!txindex.BlockUntilSyncedToCurrentChain()" + 0x29;
  local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
  local_208._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = &coinbase_script_pub_key;
  local_2b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
  ;
  local_2b0 = "";
  pvVar10 = &DAT_00000001;
  pvVar12 = (iterator)0x0;
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar5;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)local_208,1,0,WARN,(check_type)this,(size_t)&local_2b8,0x1f)
  ;
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar12;
  msg_02.m_begin = pvVar10;
  file_02.m_end = (iterator)0x21;
  file_02.m_begin = (iterator)&local_2c8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2d8,
             msg_02);
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)BaseIndex::StartBackgroundSync(&txindex.super_BaseIndex);
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  coinbase_script_pub_key.super_CScriptBase._union.indirect_contents.indirect =
       "txindex.StartBackgroundSync()";
  coinbase_script_pub_key.super_CScriptBase._union._8_8_ =
       (long)"txindex.StartBackgroundSync()" + 0x1d;
  local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
  local_208._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1f8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = &coinbase_script_pub_key;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
  ;
  local_2e0 = "";
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)local_208,2,0,WARN,(check_type)this,(size_t)&local_2e8,0x21)
  ;
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  pcVar11 = "m_node.shutdown";
  ppSVar6 = inline_assertion_check<true,util::SignalInterrupt*&>
                      (&(((TestChain100Setup *)&(this->super_TestChain100Setup).super_TestingSetup)
                        ->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node
                        .shutdown,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
                       ,0x24,"test_method","m_node.shutdown");
  IndexWaitSynced(&txindex.super_BaseIndex,*ppSVar6);
  pCVar7 = Params();
  psVar2 = (pCVar7->genesis).vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar9 = (pCVar7->genesis).vtx.
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar2; psVar9 = psVar9 + 1) {
    local_2f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
    ;
    local_2f0 = "";
    local_308 = &boost::unit_test::basic_cstring<char_const>::null;
    local_300 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_03.m_end = pvVar10;
    msg_03.m_begin = pcVar11;
    file_03.m_end = (iterator)0x29;
    file_03.m_begin = (iterator)&local_2f8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_308,
               msg_03);
    bVar5 = TxIndex::FindTx(&txindex,&(((psVar9->
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->hash).m_wrapped,&block_hash,&tx_disk);
    local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)!bVar5;
    local_180.m_message.px = (element_type *)0x0;
    local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
    coinbase_script_pub_key.super_CScriptBase._union.indirect_contents.indirect =
         "!txindex.FindTx(txn->GetHash(), block_hash, tx_disk)";
    coinbase_script_pub_key.super_CScriptBase._union._8_8_ =
         (long)"!txindex.FindTx(txn->GetHash(), block_hash, tx_disk)" + 0x34;
    local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
    local_208._0_8_ = &PTR__lazy_ostream_0113a070;
    local_1f8 = boost::unit_test::lazy_ostream::inst;
    local_1f0 = &coinbase_script_pub_key;
    local_318 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
    ;
    local_310 = "";
    pcVar11 = &DAT_00000001;
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_180,(lazy_ostream *)local_208,1,0,WARN,(check_type)this,(size_t)&local_318,
               0x29);
    boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  }
  psVar2 = (this->super_TestChain100Setup).m_coinbase_txns.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar9 = (this->super_TestChain100Setup).m_coinbase_txns.
                super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar2; psVar9 = psVar9 + 1) {
    bVar5 = TxIndex::FindTx(&txindex,&(((psVar9->
                                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr)->hash).m_wrapped,&block_hash,&tx_disk);
    if (bVar5) {
      bVar5 = transaction_identifier<false>::operator!=
                        (&(tx_disk.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->hash,&((psVar9->
                                    super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr)->hash);
      if (bVar5) {
        local_358 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
        ;
        local_350 = "";
        local_368 = &boost::unit_test::basic_cstring<char_const>::null;
        local_360 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_04.m_end = pvVar10;
        msg_04.m_begin = pcVar11;
        file_04.m_end = (iterator)0x31;
        file_04.m_begin = (iterator)&local_358;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_368
                   ,msg_04);
        local_180._0_8_ = local_180._0_8_ & 0xffffffffffffff00;
        local_180.m_message.px = (element_type *)0x0;
        local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
        local_208._0_8_ = &PTR__lazy_ostream_0113f0b0;
        local_1f8 = boost::unit_test::lazy_ostream::inst;
        local_1f0 = (CScript *)0xc61db7;
        local_378 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
        ;
        local_370 = "";
        pcVar11 = &DAT_00000001;
        pvVar10 = &DAT_00000001;
        boost::test_tools::tt_detail::report_assertion
                  (&local_180,(lazy_ostream *)local_208,1,1,WARN,(check_type)this,(size_t)&local_378
                   ,0x31);
        goto LAB_005403ad;
      }
    }
    else {
      local_328 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
      ;
      local_320 = "";
      local_338 = &boost::unit_test::basic_cstring<char_const>::null;
      local_330 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_05.m_end = pvVar10;
      msg_05.m_begin = pcVar11;
      file_05.m_end = (iterator)0x2f;
      file_05.m_begin = (iterator)&local_328;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_338,
                 msg_05);
      local_180._0_8_ = local_180._0_8_ & 0xffffffffffffff00;
      local_180.m_message.px = (element_type *)0x0;
      local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_208._8_8_ = local_208._8_8_ & 0xffffffffffffff00;
      local_208._0_8_ = &PTR__lazy_ostream_0113f070;
      local_1f8 = boost::unit_test::lazy_ostream::inst;
      local_1f0 = (CScript *)0xc61da9;
      local_348 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
      ;
      local_340 = "";
      pcVar11 = &DAT_00000001;
      pvVar10 = &DAT_00000001;
      boost::test_tools::tt_detail::report_assertion
                (&local_180,(lazy_ostream *)local_208,1,1,WARN,(check_type)this,(size_t)&local_348,
                 0x2f);
LAB_005403ad:
      boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
    }
  }
  this_00 = &(this->super_TestChain100Setup).coinbaseKey;
  iVar8 = 10;
  do {
    bVar5 = iVar8 == 0;
    iVar8 = iVar8 + -1;
    if (bVar5) {
      ValidationSignals::SyncWithValidationInterfaceQueue
                ((((TestChain100Setup *)&(this->super_TestChain100Setup).super_TestingSetup)->
                 super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
                 validation_signals._M_t.
                 super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>
                 .super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl);
      BaseIndex::Stop(&txindex.super_BaseIndex);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&tx_disk.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      TxIndex::~TxIndex(&txindex);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    CKey::GetPubKey((CPubKey *)&local_180,this_00);
    PKHash::PKHash((PKHash *)&no_txns,(CPubKey *)&local_180);
    local_1f8 = (undefined1 *)
                CONCAT44(local_1f8._4_4_,
                         no_txns.
                         super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_208._0_8_ =
         no_txns.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_208._8_8_ =
         no_txns.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_1c0 = 2;
    GetScriptForDestination
              ((CScript *)&coinbase_script_pub_key.super_CScriptBase,(CTxDestination *)local_208);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)local_208);
    no_txns.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    no_txns.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    no_txns.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pvVar12 = (iterator)0x0;
    TestChain100Setup::CreateAndProcessBlock
              ((CBlock *)local_208,&this->super_TestChain100Setup,&no_txns,
               (CScript *)&coinbase_script_pub_key.super_CScriptBase,(Chainstate *)0x0);
    peVar3 = ((local_1b8.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_388 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
    ;
    local_380 = "";
    local_398 = &boost::unit_test::basic_cstring<char_const>::null;
    local_390 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = pvVar10;
    msg_06.m_begin = pvVar12;
    file_06.m_end = (iterator)0x3c;
    file_06.m_begin = (iterator)&local_388;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_398,
               msg_06);
    local_3b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         BaseIndex::BlockUntilSyncedToCurrentChain(&txindex.super_BaseIndex);
    local_3b0.m_message.px = (element_type *)0x0;
    local_3b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_3c0 = "txindex.BlockUntilSyncedToCurrentChain()";
    local_3b8 = "";
    local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
    local_180._0_8_ = &PTR__lazy_ostream_0113a070;
    local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_168 = &local_3c0;
    local_3d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
    ;
    local_3c8 = "";
    pvVar12 = &DAT_00000001;
    pvVar10 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_3b0,(lazy_ostream *)&local_180,1,0,WARN,(check_type)this,(size_t)&local_3d0,
               0x3c);
    boost::detail::shared_count::~shared_count(&local_3b0.m_message.pn);
    other = &peVar3->hash;
    bVar5 = TxIndex::FindTx(&txindex,&other->m_wrapped,&block_hash,&tx_disk);
    if (bVar5) {
      bVar5 = transaction_identifier<false>::operator!=
                        (&(tx_disk.
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->hash,other);
      if (bVar5) {
        local_410 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
        ;
        local_408 = "";
        local_420 = &boost::unit_test::basic_cstring<char_const>::null;
        local_418 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_07.m_end = pvVar10;
        msg_07.m_begin = pvVar12;
        file_07.m_end = (iterator)0x40;
        file_07.m_begin = (iterator)&local_410;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_420
                   ,msg_07);
        local_3b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(class_property<bool>)0x0;
        local_3b0.m_message.px = (element_type *)0x0;
        local_3b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_180.m_message.px =
             (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
        local_180._0_8_ = &PTR__lazy_ostream_0113f0b0;
        local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        local_168 = (char **)0xc61db7;
        local_430 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
        ;
        local_428 = "";
        pvVar10 = &DAT_00000001;
        boost::test_tools::tt_detail::report_assertion
                  (&local_3b0,(lazy_ostream *)&local_180,1,1,WARN,(check_type)this,
                   (size_t)&local_430,0x40);
        goto LAB_00540785;
      }
    }
    else {
      local_3e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
      ;
      local_3d8 = "";
      local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_08.m_end = pvVar10;
      msg_08.m_begin = pvVar12;
      file_08.m_end = (iterator)0x3e;
      file_08.m_begin = (iterator)&local_3e0;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3f0,
                 msg_08);
      local_3b0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(class_property<bool>)0x0;
      local_3b0.m_message.px = (element_type *)0x0;
      local_3b0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
      local_180._0_8_ = &PTR__lazy_ostream_0113f070;
      local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_168 = (char **)0xc61da9;
      local_400 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txindex_tests.cpp"
      ;
      local_3f8 = "";
      pvVar10 = &DAT_00000001;
      boost::test_tools::tt_detail::report_assertion
                (&local_3b0,(lazy_ostream *)&local_180,1,1,WARN,(check_type)this,(size_t)&local_400,
                 0x3e);
LAB_00540785:
      boost::detail::shared_count::~shared_count(&local_3b0.m_message.pn);
    }
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&local_1b8);
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector(&no_txns);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              (&coinbase_script_pub_key.super_CScriptBase);
  } while( true );
}

Assistant:

BOOST_FIXTURE_TEST_CASE(txindex_initial_sync, TestChain100Setup)
{
    TxIndex txindex(interfaces::MakeChain(m_node), 1 << 20, true);
    BOOST_REQUIRE(txindex.Init());

    CTransactionRef tx_disk;
    uint256 block_hash;

    // Transaction should not be found in the index before it is started.
    for (const auto& txn : m_coinbase_txns) {
        BOOST_CHECK(!txindex.FindTx(txn->GetHash(), block_hash, tx_disk));
    }

    // BlockUntilSyncedToCurrentChain should return false before txindex is started.
    BOOST_CHECK(!txindex.BlockUntilSyncedToCurrentChain());

    BOOST_REQUIRE(txindex.StartBackgroundSync());

    // Allow tx index to catch up with the block index.
    IndexWaitSynced(txindex, *Assert(m_node.shutdown));

    // Check that txindex excludes genesis block transactions.
    const CBlock& genesis_block = Params().GenesisBlock();
    for (const auto& txn : genesis_block.vtx) {
        BOOST_CHECK(!txindex.FindTx(txn->GetHash(), block_hash, tx_disk));
    }

    // Check that txindex has all txs that were in the chain before it started.
    for (const auto& txn : m_coinbase_txns) {
        if (!txindex.FindTx(txn->GetHash(), block_hash, tx_disk)) {
            BOOST_ERROR("FindTx failed");
        } else if (tx_disk->GetHash() != txn->GetHash()) {
            BOOST_ERROR("Read incorrect tx");
        }
    }

    // Check that new transactions in new blocks make it into the index.
    for (int i = 0; i < 10; i++) {
        CScript coinbase_script_pub_key = GetScriptForDestination(PKHash(coinbaseKey.GetPubKey()));
        std::vector<CMutableTransaction> no_txns;
        const CBlock& block = CreateAndProcessBlock(no_txns, coinbase_script_pub_key);
        const CTransaction& txn = *block.vtx[0];

        BOOST_CHECK(txindex.BlockUntilSyncedToCurrentChain());
        if (!txindex.FindTx(txn.GetHash(), block_hash, tx_disk)) {
            BOOST_ERROR("FindTx failed");
        } else if (tx_disk->GetHash() != txn.GetHash()) {
            BOOST_ERROR("Read incorrect tx");
        }
    }

    // It is not safe to stop and destroy the index until it finishes handling
    // the last BlockConnected notification. The BlockUntilSyncedToCurrentChain()
    // call above is sufficient to ensure this, but the
    // SyncWithValidationInterfaceQueue() call below is also needed to ensure
    // TSAN always sees the test thread waiting for the notification thread, and
    // avoid potential false positive reports.
    m_node.validation_signals->SyncWithValidationInterfaceQueue();

    // shutdown sequence (c.f. Shutdown() in init.cpp)
    txindex.Stop();
}